

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd_opt.c
# Opt level: O0

void ZSTD_updateTree(ZSTD_matchState_t *ms,BYTE *ip,BYTE *iend)

{
  U32 mls;
  BYTE *pBVar1;
  uint uVar2;
  U32 UVar3;
  BYTE *iend_local;
  BYTE *ip_local;
  ZSTD_matchState_t *ms_local;
  U32 idx;
  U32 target;
  BYTE *base;
  
  mls = (ms->cParams).minMatch;
  pBVar1 = (ms->window).base;
  uVar2 = (int)ip - (int)pBVar1;
  for (ms_local._0_4_ = ms->nextToUpdate; (U32)ms_local < uVar2;
      ms_local._0_4_ = UVar3 + (U32)ms_local) {
    UVar3 = ZSTD_insertBt1(ms,pBVar1 + (U32)ms_local,iend,mls,0);
  }
  ms->nextToUpdate = uVar2;
  return;
}

Assistant:

void ZSTD_updateTree(ZSTD_matchState_t* ms, const BYTE* ip, const BYTE* iend) {
    ZSTD_updateTree_internal(ms, ip, iend, ms->cParams.minMatch, ZSTD_noDict);
}